

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O3

int idaLsBandDQJac(sunrealtype tt,sunrealtype c_j,N_Vector yy,N_Vector yp,N_Vector rr,SUNMatrix Jac,
                  IDAMem IDA_mem,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  long *plVar1;
  double dVar2;
  void *pvVar3;
  int iVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  sunindextype sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  sunrealtype *psVar16;
  sunindextype sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long j;
  long lVar23;
  bool bVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double local_110;
  long local_100;
  long local_f8;
  long local_f0;
  
  pvVar3 = IDA_mem->ida_lmem;
  sVar5 = SUNBandMatrix_Columns(Jac);
  sVar6 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar7 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar8 = N_VGetArrayPointer(IDA_mem->ida_ewt);
  lVar9 = N_VGetArrayPointer(rr);
  lVar10 = N_VGetArrayPointer(yy);
  lVar11 = N_VGetArrayPointer(yp);
  lVar12 = N_VGetArrayPointer(tmp1);
  lVar13 = N_VGetArrayPointer(tmp2);
  lVar14 = N_VGetArrayPointer(tmp3);
  if (IDA_mem->ida_constraintsSet == 0) {
    local_100 = 0;
  }
  else {
    local_100 = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }
  N_VScale(0x3ff0000000000000,yy,tmp2);
  N_VScale(0x3ff0000000000000,yp,tmp3);
  dVar2 = IDA_mem->ida_uround;
  local_110 = 0.0;
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      local_110 = sqrt(dVar2);
    }
    else {
      local_110 = SQRT(dVar2);
    }
  }
  lVar15 = sVar6 + sVar7 + 1;
  sVar17 = sVar5;
  if (lVar15 < sVar5) {
    sVar17 = lVar15;
  }
  if (0 < sVar17) {
    local_f0 = -sVar6;
    local_f8 = 0;
    lVar21 = 1;
    do {
      j = lVar21 + -1;
      iVar4 = IDA_mem->ida_constraintsSet;
      lVar18 = j;
      do {
        dVar2 = *(double *)(lVar10 + lVar18 * 8);
        dVar27 = *(double *)(lVar11 + lVar18 * 8) * IDA_mem->ida_hh;
        dVar28 = ABS(dVar27);
        dVar26 = ABS(dVar2);
        if (ABS(dVar2) <= dVar28) {
          dVar26 = dVar28;
        }
        dVar29 = 1.0 / *(double *)(lVar8 + lVar18 * 8);
        dVar28 = dVar26 * local_110;
        if (dVar26 * local_110 <= dVar29) {
          dVar28 = dVar29;
        }
        uVar25 = -(ulong)(dVar27 < 0.0);
        dVar26 = ((double)((ulong)-dVar28 & uVar25 | ~uVar25 & (ulong)dVar28) + dVar2) - dVar2;
        if (iVar4 != 0) {
          dVar27 = *(double *)(local_100 + lVar18 * 8);
          dVar28 = ABS(dVar27);
          if ((dVar28 != 1.0) || (NAN(dVar28))) {
            if ((dVar28 == 2.0) && ((!NAN(dVar28) && ((dVar2 + dVar26) * dVar27 <= 0.0))))
            goto LAB_00114d05;
          }
          else if ((dVar2 + dVar26) * dVar27 < 0.0) {
LAB_00114d05:
            dVar26 = -dVar26;
          }
        }
        *(double *)(lVar13 + lVar18 * 8) = dVar26 + *(double *)(lVar13 + lVar18 * 8);
        *(double *)(lVar14 + lVar18 * 8) = c_j * dVar26 + *(double *)(lVar14 + lVar18 * 8);
        lVar18 = lVar18 + lVar15;
      } while (lVar18 < sVar5);
      iVar4 = (*IDA_mem->ida_res)(tt,tmp2,tmp3,tmp1,IDA_mem->ida_user_data);
      plVar1 = (long *)((long)pvVar3 + 0xa8);
      *plVar1 = *plVar1 + 1;
      lVar18 = local_f8;
      lVar22 = local_f0;
      if (iVar4 != 0) {
        return iVar4;
      }
      do {
        lVar23 = 0;
        if (0 < lVar22) {
          lVar23 = lVar22;
        }
        dVar2 = *(double *)(lVar10 + j * 8);
        *(double *)(lVar13 + j * 8) = dVar2;
        dVar26 = *(double *)(lVar11 + j * 8);
        *(double *)(lVar14 + j * 8) = dVar26;
        psVar16 = SUNBandMatrix_Column(Jac,j);
        dVar26 = dVar26 * IDA_mem->ida_hh;
        dVar28 = ABS(dVar26);
        dVar27 = ABS(dVar2);
        if (ABS(dVar2) <= dVar28) {
          dVar27 = dVar28;
        }
        dVar29 = 1.0 / *(double *)(lVar8 + j * 8);
        dVar28 = dVar27 * local_110;
        if (dVar27 * local_110 <= dVar29) {
          dVar28 = dVar29;
        }
        uVar25 = -(ulong)(dVar26 < 0.0);
        dVar26 = ((double)((ulong)-dVar28 & uVar25 | ~uVar25 & (ulong)dVar28) + dVar2) - dVar2;
        if (IDA_mem->ida_constraintsSet != 0) {
          dVar27 = *(double *)(local_100 + j * 8);
          dVar28 = ABS(dVar27);
          if ((dVar28 != 1.0) || (NAN(dVar28))) {
            if ((dVar28 == 2.0) && ((!NAN(dVar28) && ((dVar2 + dVar26) * dVar27 <= 0.0))))
            goto LAB_00114ec6;
          }
          else if ((dVar2 + dVar26) * dVar27 < 0.0) {
LAB_00114ec6:
            dVar26 = -dVar26;
          }
        }
        lVar20 = j - sVar6;
        if (lVar20 < 1) {
          lVar20 = 0;
        }
        lVar19 = sVar7 + j;
        if (sVar5 + -1 <= sVar7 + j) {
          lVar19 = sVar5 + -1;
        }
        if (lVar20 <= lVar19) {
          lVar23 = lVar23 + -1;
          do {
            *(double *)((long)psVar16 + lVar23 * 8 + lVar18 + 8) =
                 (*(double *)(lVar12 + 8 + lVar23 * 8) - *(double *)(lVar9 + 8 + lVar23 * 8)) *
                 (1.0 / dVar26);
            lVar23 = lVar23 + 1;
          } while (lVar23 < lVar19);
        }
        j = j + lVar15;
        lVar18 = lVar18 + ~(sVar6 + sVar7) * 8;
        lVar22 = lVar22 + lVar15;
      } while (j < sVar5);
      local_f0 = local_f0 + 1;
      local_f8 = local_f8 + -8;
      bVar24 = lVar21 != sVar17;
      lVar21 = lVar21 + 1;
    } while (bVar24);
  }
  return 0;
}

Assistant:

int idaLsBandDQJac(sunrealtype tt, sunrealtype c_j, N_Vector yy, N_Vector yp,
                   N_Vector rr, SUNMatrix Jac, IDAMem IDA_mem, N_Vector tmp1,
                   N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype inc, inc_inv, yj, ypj, srur, conj, ewtj;
  sunrealtype *y_data, *yp_data, *ewt_data, *cns_data = NULL;
  sunrealtype *ytemp_data, *yptemp_data, *rtemp_data, *r_data, *col_j;
  N_Vector rtemp, ytemp, yptemp;
  sunindextype i, j, i1, i2, width, ngroups, group;
  sunindextype N, mupper, mlower;
  IDALsMem idals_mem;
  int retval = 0;

  /* access LsMem interface structure */
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of r, y and yp */
  rtemp  = tmp1;
  ytemp  = tmp2;
  yptemp = tmp3;

  /* Obtain pointers to the data for all eight vectors used.  */
  ewt_data    = N_VGetArrayPointer(IDA_mem->ida_ewt);
  r_data      = N_VGetArrayPointer(rr);
  y_data      = N_VGetArrayPointer(yy);
  yp_data     = N_VGetArrayPointer(yp);
  rtemp_data  = N_VGetArrayPointer(rtemp);
  ytemp_data  = N_VGetArrayPointer(ytemp);
  yptemp_data = N_VGetArrayPointer(yptemp);
  if (IDA_mem->ida_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }

  /* Initialize ytemp and yptemp. */
  N_VScale(ONE, yy, ytemp);
  N_VScale(ONE, yp, yptemp);

  /* Compute miscellaneous values for the Jacobian computation. */
  srur    = SUNRsqrt(IDA_mem->ida_uround);
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all yy[j] and yp[j] for j in this group. */
    for (j = group - 1; j < N; j += width)
    {
      yj   = y_data[j];
      ypj  = yp_data[j];
      ewtj = ewt_data[j];

      /* Set increment inc to yj based on sqrt(uround)*abs(yj), with
        adjustments using ypj and ewtj if this is small, and a further
        adjustment to give it the same sign as hh*ypj. */
      inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                   ONE / ewtj);
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;

      /* Adjust sign(inc) again if yj has an inequality constraint. */
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Increment yj and ypj. */
      ytemp_data[j] += inc;
      yptemp_data[j] += c_j * inc;
    }

    /* Call res routine with incremented arguments. */
    retval = IDA_mem->ida_res(tt, ytemp, yptemp, rtemp, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval != 0) { break; }

    /* Loop over the indices j in this group again. */
    for (j = group - 1; j < N; j += width)
    {
      /* Reset ytemp and yptemp components that were perturbed. */
      yj = ytemp_data[j] = y_data[j];
      ypj = yptemp_data[j] = yp_data[j];
      col_j                = SUNBandMatrix_Column(Jac, j);
      ewtj                 = ewt_data[j];

      /* Set increment inc exactly as above. */
      inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                   ONE / ewtj);
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Load the difference quotient Jacobian elements for column j */
      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (rtemp_data[i] - r_data[i]);
      }
    }
  }

  return (retval);
}